

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_terminator.h
# Opt level: O1

int __thiscall
PlayerTerminator::move(PlayerTerminator *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  pointer *ppMVar1;
  Move MVar2;
  int iVar3;
  int iVar4;
  pointer pMVar5;
  vector<Move,_std::allocator<Move>_> *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar17;
  int *piVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  vector<Move,_std::allocator<Move>_> invertedMoveHistory;
  PlayerNext next;
  PlayerCycle_3 cycle_3;
  PlayerCopy copy;
  PlayerDelay delay;
  PlayerDelay_2 delay_2;
  vector<Move,_std::allocator<Move>_> local_178;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  undefined **local_138;
  undefined1 *local_130;
  undefined1 local_128 [8];
  undefined1 local_120 [16];
  int local_110;
  Move local_108;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  _func_int *local_f0;
  char local_e8 [16];
  int local_d8;
  undefined **local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  int local_a8 [2];
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  vector<Move,_std::allocator<Move>_> *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar15;
  ulong uVar16;
  
  local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_138 = (undefined **)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"terminator","");
  local_a0 = (undefined1  [8])&PTR__Player_0010c820;
  local_98._M_p = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_138,(undefined1 *)((long)local_138 + (long)local_130));
  local_a0 = (undefined1  [8])&PTR__Player_0010cc88;
  if (local_138 != (undefined **)local_128) {
    operator_delete(local_138);
  }
  local_138 = (undefined **)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"terminator","");
  local_78 = (undefined1  [8])&PTR__Player_0010c820;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_138,(undefined1 *)((long)local_138 + (long)local_130));
  local_78 = (undefined1  [8])&PTR__Player_0010cd08;
  if (local_138 != (undefined **)local_128) {
    operator_delete(local_138);
  }
  local_d0 = (undefined **)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"terminator","");
  local_138 = &PTR__Player_0010c820;
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_d0,(undefined1 *)((long)local_d0 + (long)local_c8));
  local_138 = &PTR__Player_0010c9c8;
  local_110 = 0;
  if (local_d0 != (undefined **)local_c0) {
    operator_delete(local_d0);
  }
  local_100 = (undefined1  [8])&local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"terminator","");
  local_d0 = &PTR__Player_0010c820;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_100,local_f8._M_p + (long)local_100);
  local_d0 = &PTR__Player_0010c988;
  local_a8[0] = 0;
  if (local_100 != (undefined1  [8])&local_f0) {
    operator_delete((void *)local_100);
  }
  ppMVar1 = &local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"terminator","");
  local_100 = (undefined1  [8])&PTR__Player_0010c820;
  local_f8._M_p = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,
             local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)&(local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_me +
             (long)&(local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                     super__Vector_impl_data._M_finish)->m_me));
  local_100 = (undefined1  [8])&PTR__Player_0010c948;
  local_d8 = rand();
  local_d8 = local_d8 % 3;
  if (local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppMVar1) {
    operator_delete(local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Move *)0x0;
  std::vector<Move,_std::allocator<Move>_>::reserve
            (&local_178,
             (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  uVar15 = 0;
  if ((moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.super__Vector_impl_data
      ._M_finish ==
      (moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar17 = 0;
    uVar19 = 0;
    uVar22 = 0;
    uVar20 = 0;
    uVar16 = 0;
  }
  else {
    local_148 = 0;
    local_150 = 0;
    uVar15 = 0;
    local_140 = 0;
    uVar16 = 0;
    uVar19 = 0;
    local_50 = moveHistory;
    do {
      pvVar6 = local_50;
      iVar7 = PlayerDelay::move((PlayerDelay *)local_a0,&local_178);
      iVar8 = PlayerDelay_2::move((PlayerDelay_2 *)local_78,&local_178);
      local_40 = uVar19;
      local_38 = uVar16;
      iVar9 = local_110;
      if (local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        iVar9 = beats(local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].m_you);
      }
      local_48 = uVar15;
      piVar18 = &local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].m_you;
      if (local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        piVar18 = local_a8;
      }
      iVar3 = *piVar18;
      iVar10 = PlayerCycle_3::move((PlayerCycle_3 *)local_100,&local_178);
      pMVar5 = (pvVar6->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = pMVar5[local_140].m_you;
      MVar2 = pMVar5[local_140];
      local_108.m_you = MVar2.m_me;
      local_108.m_me = MVar2.m_you;
      if (local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Move,_std::allocator<Move>_>::_M_realloc_insert<Move>
                  (&local_178,
                   (iterator)
                   local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_108);
      }
      else {
        *local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_108;
        local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = (int)local_148 + (uint)(iVar7 == iVar4);
      local_148 = (ulong)uVar11;
      uVar12 = (int)local_150 + (uint)(iVar8 == iVar4);
      local_150 = (ulong)uVar12;
      uVar13 = (int)local_48 + (uint)(iVar9 == iVar4);
      uVar15 = (ulong)uVar13;
      uVar21 = (int)local_40 + (uint)(iVar3 == iVar4);
      uVar19 = (ulong)uVar21;
      uVar14 = (int)local_38 + (uint)(iVar10 == iVar4);
      uVar16 = (ulong)uVar14;
      local_140 = local_140 + 1;
      uVar17 = (long)(local_50->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_50->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    } while (local_140 < uVar17);
    uVar19 = (ulong)(uVar14 * 2);
    uVar22 = (ulong)(uVar13 * 2);
    uVar20 = (ulong)(uVar12 * 2);
    uVar16 = (ulong)(uVar11 * 2);
    uVar15 = (ulong)(uVar21 * 2);
    moveHistory = local_50;
  }
  if (uVar17 < uVar19) {
    iVar9 = PlayerCycle_3::move((PlayerCycle_3 *)local_100,&local_178);
  }
  else if (uVar17 < uVar22) {
    iVar9 = local_110;
    if (local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      iVar9 = beats(local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].m_you);
    }
  }
  else if (uVar17 < uVar20) {
    iVar9 = PlayerDelay_2::move((PlayerDelay_2 *)local_78,&local_178);
  }
  else if (uVar17 < uVar16) {
    iVar9 = PlayerDelay::move((PlayerDelay *)local_a0,&local_178);
  }
  else {
    if (uVar15 <= uVar17) {
      iVar9 = PlayerDelay::move((PlayerDelay *)local_a0,moveHistory);
      goto LAB_00106b54;
    }
    piVar18 = &local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].m_you;
    if (local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      piVar18 = local_a8;
    }
    iVar9 = *piVar18;
  }
  iVar9 = beats(iVar9);
LAB_00106b54:
  if (local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100 = (undefined1  [8])&PTR__Player_0010c820;
  if (local_f8._M_p != local_e8) {
    operator_delete(local_f8._M_p);
  }
  local_d0 = &PTR__Player_0010c820;
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  local_138 = &PTR__Player_0010c820;
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  local_78 = (undefined1  [8])&PTR__Player_0010c820;
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  local_a0 = (undefined1  [8])&PTR__Player_0010c820;
  if (local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  return iVar9;
}

Assistant:

int move(const std::vector<Move>& moveHistory)
   {
      PlayerDelay   delay("terminator");
      PlayerDelay_2 delay_2("terminator");
      PlayerNext    next("terminator", 0);
      PlayerCopy    copy("terminator", 0);
      PlayerCycle_3 cycle_3("terminator");

      // Loop over all the moves played so far, and count the number of times
      // the move played by the opponent matches that predicted by our local
      // instantiation of DELAY.
      std::vector<Move> invertedMoveHistory;
      invertedMoveHistory.reserve(moveHistory.size());   // Optimization
      unsigned int correctDelay   = 0;
      unsigned int correctDelay_2 = 0;
      unsigned int correctNext    = 0;
      unsigned int correctCopy    = 0;
      unsigned int correctCycle_3 = 0;
      for (size_t i=0; i<moveHistory.size(); ++i)
      {
         const int predictedMoveDelay   = delay.move(invertedMoveHistory);
         const int predictedMoveDelay_2 = delay_2.move(invertedMoveHistory);
         const int predictedMoveNext    = next.move(invertedMoveHistory);
         const int predictedMoveCopy    = copy.move(invertedMoveHistory);
         const int predictedMoveCycle_3 = cycle_3.move(invertedMoveHistory);
         const Move& playedMove = moveHistory[i];

         if (predictedMoveDelay == playedMove.m_you)
         {
            correctDelay += 1;
         }
         if (predictedMoveDelay_2 == playedMove.m_you)
         {
            correctDelay_2 += 1;
         }
         if (predictedMoveNext == playedMove.m_you)
         {
            correctNext += 1;
         }
         if (predictedMoveCopy == playedMove.m_you)
         {
            correctCopy += 1;
         }
         if (predictedMoveCycle_3 == playedMove.m_you)
         {
            correctCycle_3 += 1;
         }

         // Update moveHistory with the inverted moves (i.e. as seen by the
         // opponent).
         invertedMoveHistory.push_back(Move(playedMove.m_you, playedMove.m_me));
      }

#ifdef DEBUG
      std::cout << (correctDelay*100.0) / moveHistory.size() << "  " << std::endl;
#endif

      // Determine if the noves played by our opponent matches that of DELAY.
      // If so, play whatever beats DELAY. Otherwise, just copy DELAY's strategy.
      if (correctCycle_3*2 > moveHistory.size())
         return beats(cycle_3.move(invertedMoveHistory));
      else if (correctNext*2 > moveHistory.size())
         return beats(next.move(invertedMoveHistory));
      else if (correctDelay_2*2 > moveHistory.size())
         return beats(delay_2.move(invertedMoveHistory));
      else if (correctDelay*2 > moveHistory.size())
         return beats(delay.move(invertedMoveHistory));
      else if (correctCopy*2 > moveHistory.size())
         return beats(copy.move(invertedMoveHistory));
      else
         return delay.move(moveHistory);

   }